

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O2

int __thiscall
CVmResFileSource::clone
          (CVmResFileSource *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  unsigned_long uVar1;
  osfildef *poVar2;
  undefined8 *puVar3;
  
  poVar2 = osfdup(this->fp,(char *)__fn);
  if (poVar2 == (osfildef *)0x0) {
    puVar3 = (undefined8 *)0x0;
  }
  else {
    puVar3 = (undefined8 *)operator_new(0x20);
    *puVar3 = &PTR__CVmResFileSource_0035d1c0;
    puVar3[1] = poVar2;
    uVar1 = this->end;
    puVar3[2] = this->start;
    puVar3[3] = uVar1;
  }
  return (int)puVar3;
}

Assistant:

virtual CVmDataSource *clone(VMG_ const char *mode)
    {
        /* duplicate our underlying file handle */
        osfildef *fpdup = osfdup(fp, mode);
        if (fpdup == 0)
            return 0;

        /* return a new source wrapping the duplicated file handle */
        return new CVmResFileSource(fpdup, start, end);
    }